

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_tester.cpp
# Opt level: O0

int main(int argc,char **args)

{
  uint count;
  int iVar1;
  ostream *poVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  long *chunk_locations_00;
  char *__dest;
  reference this;
  size_t __n;
  string local_380;
  int local_360;
  int local_35c;
  int x_1;
  int x;
  int local_33c;
  undefined1 local_338 [4];
  int in;
  ofstream ofile;
  char *local_138;
  char *fp_m;
  undefined1 local_110 [8];
  WrestlerLoader wl;
  char *fp;
  long *chunk_locations;
  unsigned_long skip_byte_loc;
  int size;
  int wrestler_count_loc;
  vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_> p;
  string local_58 [8];
  string output_name;
  string filename;
  char **args_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(output_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_58);
  if (argc < 2) {
    std::__cxx11::string::operator=((string *)(output_name.field_2._M_local_buf + 8),"savedata");
  }
  else {
    std::__cxx11::string::operator=((string *)(output_name.field_2._M_local_buf + 8),args[1]);
  }
  if (argc < 3) {
    std::__cxx11::string::operator=(local_58,"output");
  }
  else {
    std::__cxx11::string::operator=(local_58,args[2]);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"loading from file ");
  poVar2 = std::operator<<(poVar2,(string *)(output_name.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::vector
            ((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
              *)&size);
  std::__cxx11::string::string((string *)&fp_m,(string *)(output_name.field_2._M_local_buf + 8));
  fp_remover::loaders::WrestlerLoader::WrestlerLoader((WrestlerLoader *)local_110,(string *)&fp_m);
  std::__cxx11::string::~string((string *)&fp_m);
  std::ofstream::ofstream(local_338);
  for (local_33c = 1; local_33c < 10; local_33c = local_33c + 1) {
    fp_remover::loaders::WrestlerLoader::load((WrestlerLoader *)local_110);
    poVar2 = std::operator<<((ostream *)&std::cout,"load succesful");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    count = fp_remover::loaders::WrestlerLoader::get_record_loc((WrestlerLoader *)local_110);
    uVar3 = fp_remover::loaders::WrestlerLoader::get_byte_skip_loc((WrestlerLoader *)local_110);
    fp_remover::loaders::WrestlerLoader::get_wrestlers
              ((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                *)&x_1,(WrestlerLoader *)local_110);
    std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
    operator=((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
               *)&size,(vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                        *)&x_1);
    std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
    ~vector((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_> *
            )&x_1);
    wl.filesize = (unsigned_long)
                  fp_remover::loaders::WrestlerLoader::get_file_p((WrestlerLoader *)local_110);
    uVar4 = fp_remover::loaders::WrestlerLoader::get_filesize((WrestlerLoader *)local_110);
    iVar1 = (int)uVar4;
    chunk_locations_00 =
         fp_remover::loaders::WrestlerLoader::get_chunk_locations((WrestlerLoader *)local_110);
    __dest = (char *)operator_new__((long)iVar1);
    local_138 = __dest;
    memcpy(__dest,(void *)wl.filesize,(long)iVar1);
    local_138 = __dest;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_33c);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,"CHUNK DATA:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_35c = 0; local_35c < 0x11; local_35c = local_35c + 1) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,*(int *)(local_138 + chunk_locations_00[local_35c]))
      ;
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    for (local_360 = 0; local_360 < 5; local_360 = local_360 + 1) {
      this = std::
             vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
             at((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                 *)&size,(long)local_360);
      fp_remover::classes::Character::get_name_abi_cxx11_(&local_380,&this->super_Character);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_380);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_380);
    }
    __n = (size_t)count;
    uVar3 = remove_wrestler(&local_138,
                            (vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                             *)&size,0,count,uVar3,(long)iVar1,chunk_locations_00);
    fp_remover::loaders::WrestlerLoader::write
              ((WrestlerLoader *)local_110,(int)local_138,(void *)(uVar3 & 0xffffffff),__n);
    wl.filesize = 0;
    if (local_138 != (char *)0x0) {
      operator_delete__(local_138);
    }
    local_138 = (char *)0x0;
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(local_338);
  fp_remover::loaders::WrestlerLoader::~WrestlerLoader((WrestlerLoader *)local_110);
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
  ~vector((vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_> *)
          &size);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(output_name.field_2._M_local_buf + 8));
  return 0;
}

Assistant:

int main(int argc, char* args[])
{
	string filename;
	string output_name;
	if(argc > 1) filename = args[1];
	else filename = "savedata";
	if(argc > 2) output_name = args[2];
	else output_name = "output";

	cout << "loading from file " << filename << endl;

	vector<Wrestler> p;
	int wrestler_count_loc, size;
	unsigned long skip_byte_loc;
	const long int *chunk_locations;
	const char* fp;

	{
		WrestlerLoader wl(filename);
		char* fp_m;
		ofstream ofile;
		for(int in = 1; in < 10; in++)
		{

			wl.load();
			cout << "load succesful" << endl; // testing
			wrestler_count_loc = wl.get_record_loc();
			skip_byte_loc = wl.get_byte_skip_loc();
			p = wl.get_wrestlers();
			fp = wl.get_file_p();
			size = wl.get_filesize();
			chunk_locations = wl.get_chunk_locations();

			//cout << "removing " << p.at(in).get_name() << endl; 

			fp_m = new char[size];

			fp_m = (char*) memcpy(fp_m, fp, size);

			cout << in << " - " << "CHUNK DATA:" << endl;
			for( int x = 0; x < NUM_CHUNKS; x++)
			{
				cout << *(int*) &fp_m[chunk_locations[x]] << endl;
			}
			
			//for(auto& x : p) cout << x.get_name() << endl;
			for( int x = 0; x < 5; x++) cout << p.at(x).get_name() << endl;
			// remove wrestler at in input from the user
			size = remove_wrestler(fp_m, p, 0, wrestler_count_loc, skip_byte_loc, size, chunk_locations);

			wl.write(fp_m, size);

			//ofile.open(output_name, ios_base::binary | ios_base::trunc);
			//ofile.write(fp_m, size);
			//ofile.close();
			fp = nullptr;
			delete [] fp_m;
			fp_m = nullptr;
			chunk_locations = nullptr;
			//p.clear();
			cout << endl;
		}

	} // destroy uneeded loader
	return 0;
}